

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall
fasttext::Args::parseArgs
          (Args *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  char *pcVar6;
  ostream *poVar7;
  Args *pAVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  float fVar9;
  out_of_range anon_var_0;
  float tmp;
  int ai;
  string command;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  Args *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbd8;
  Args *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  string local_168 [32];
  string local_148 [32];
  undefined1 local_128 [68];
  float local_e4;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  int local_40;
  string local_30 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RSI,1);
  std::__cxx11::string::string(local_30,(string *)pvVar3);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffbd0,
                          (char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0xa4) = 3;
    *(undefined4 *)(in_RDI + 0xa0) = 3;
    *(undefined4 *)(in_RDI + 0x90) = 1;
    *(undefined4 *)(in_RDI + 0xac) = 0;
    *(undefined4 *)(in_RDI + 0xb0) = 0;
    *(undefined8 *)(in_RDI + 0x78) = 0x3fb999999999999a;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbd0,
                            (char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0xa4) = 1;
    }
  }
  local_40 = 2;
  while( true ) {
    uVar4 = (ulong)local_40;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_10);
    if (sVar5 <= uVar4) {
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        if ((*(int *)(in_RDI + 0x9c) < 2) &&
           ((*(int *)(in_RDI + 0xb0) == 0 && (bVar1 = hasAutotune((Args *)0x187082), !bVar1)))) {
          *(undefined4 *)(in_RDI + 0xa8) = 0;
        }
        std::__cxx11::string::~string(local_30);
        return;
      }
      pAVar8 = (Args *)std::operator<<((ostream *)&std::cerr,"Empty input or output path.");
      std::ostream::operator<<(pAVar8,std::endl<char,std::char_traits<char>>);
      printHelp(pAVar8);
      exit(1);
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_10,(long)local_40);
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)pvVar3);
    if (*pcVar6 != '-') {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Provided argument without a dash! Usage:");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      printHelp(in_stack_fffffffffffffbd0);
      exit(1);
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_10,(long)local_40);
    std::__cxx11::string::substr((ulong)local_60,(ulong)pvVar3);
    setManual(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    std::__cxx11::string::~string(local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_10,(long)local_40);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbd0,
                            (char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
    if (bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_10,(long)local_40);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbd0,
                            (char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
    if (bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffbd0,
                    CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
      std::__cxx11::string::string(local_80,(string *)pvVar3);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x38),local_80);
      std::__cxx11::string::~string(local_80);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_10,(long)local_40);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffbd0,
                              (char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8))
      ;
      if (bVar1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffbd0,
                      CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
        std::__cxx11::string::string(local_a0,(string *)pvVar3);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x58),local_a0);
        std::__cxx11::string::~string(local_a0);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_10,(long)local_40);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffbd0,
                                (char *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8
                                                ));
        if (bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffbd0,
               CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
          fVar9 = std::__cxx11::stof((string *)in_stack_fffffffffffffbd0,
                                     (size_t *)
                                     CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
          *(double *)(in_RDI + 0x78) = (double)fVar9;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_10,(long)local_40);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffbd0,
                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                   in_stack_fffffffffffffbc8));
          if (bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffbd0,
                 CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
            iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                       (size_t *)
                                       CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8)
                                       ,0);
            *(int *)(in_RDI + 0x80) = iVar2;
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_10,(long)local_40);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffbd0,
                                    (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                     in_stack_fffffffffffffbc8));
            if (bVar1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffbd0,
                   CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
              iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                         (size_t *)
                                         CONCAT17(in_stack_fffffffffffffbcf,
                                                  in_stack_fffffffffffffbc8),0);
              *(int *)(in_RDI + 0x84) = iVar2;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_10,(long)local_40);
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffbd0,
                                      (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                       in_stack_fffffffffffffbc8));
              if (bVar1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffbd0,
                     CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                           (size_t *)
                                           CONCAT17(in_stack_fffffffffffffbcf,
                                                    in_stack_fffffffffffffbc8),0);
                *(int *)(in_RDI + 0x88) = iVar2;
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_10,(long)local_40);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffbd0,
                                        (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                         in_stack_fffffffffffffbc8));
                if (bVar1) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffbd0,
                       CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                  iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                             (size_t *)
                                             CONCAT17(in_stack_fffffffffffffbcf,
                                                      in_stack_fffffffffffffbc8),0);
                  *(int *)(in_RDI + 0x8c) = iVar2;
                }
                else {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_10,(long)local_40);
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffffbd0,
                                          (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                  if (bVar1) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffbd0,
                         CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                    iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                               (size_t *)
                                               CONCAT17(in_stack_fffffffffffffbcf,
                                                        in_stack_fffffffffffffbc8),0);
                    *(int *)(in_RDI + 0x90) = iVar2;
                  }
                  else {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_10,(long)local_40);
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffffbd0,
                                            (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                             in_stack_fffffffffffffbc8));
                    if (bVar1) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffbd0,
                           CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                      iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                                 (size_t *)
                                                 CONCAT17(in_stack_fffffffffffffbcf,
                                                          in_stack_fffffffffffffbc8),0);
                      *(int *)(in_RDI + 0x94) = iVar2;
                    }
                    else {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](local_10,(long)local_40);
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_fffffffffffffbd0,
                                              (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                               in_stack_fffffffffffffbc8));
                      if (bVar1) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffffbd0,
                             CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                        iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                                   (size_t *)
                                                   CONCAT17(in_stack_fffffffffffffbcf,
                                                            in_stack_fffffffffffffbc8),0);
                        *(int *)(in_RDI + 0x98) = iVar2;
                      }
                      else {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_10,(long)local_40);
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)in_stack_fffffffffffffbd0,
                                                (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                 in_stack_fffffffffffffbc8));
                        if (bVar1) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffffbd0,
                               CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                          iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                                     (size_t *)
                                                     CONCAT17(in_stack_fffffffffffffbcf,
                                                              in_stack_fffffffffffffbc8),0);
                          *(int *)(in_RDI + 0x9c) = iVar2;
                        }
                        else {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](local_10,(long)local_40);
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                          if (bVar1) {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_fffffffffffffbd0,
                                 CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                            if (bVar1) {
                              *(undefined4 *)(in_RDI + 0xa0) = 1;
                            }
                            else {
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)in_stack_fffffffffffffbd0,
                                   CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                              if (bVar1) {
                                *(undefined4 *)(in_RDI + 0xa0) = 2;
                              }
                              else {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)in_stack_fffffffffffffbd0,
                                     CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                if (bVar1) {
                                  *(undefined4 *)(in_RDI + 0xa0) = 3;
                                }
                                else {
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)in_stack_fffffffffffffbd0,
                                       CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8)
                                      );
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                  if (!bVar1) {
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)in_stack_fffffffffffffbd0,
                                         CONCAT17(in_stack_fffffffffffffbcf,
                                                  in_stack_fffffffffffffbc8));
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                    if (!bVar1) {
                                      poVar7 = std::operator<<((ostream *)&std::cerr,
                                                               "Unknown loss: ");
                                      pvVar3 = std::
                                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                      poVar7 = std::operator<<(poVar7,(string *)pvVar3);
                                      std::ostream::operator<<
                                                (poVar7,std::endl<char,std::char_traits<char>>);
                                      printHelp(in_stack_fffffffffffffbd0);
                                      exit(1);
                                    }
                                  }
                                  *(undefined4 *)(in_RDI + 0xa0) = 4;
                                }
                              }
                            }
                          }
                          else {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](local_10,(long)local_40);
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                            if (bVar1) {
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)in_stack_fffffffffffffbd0,
                                   CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                              iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                                         (size_t *)
                                                         CONCAT17(in_stack_fffffffffffffbcf,
                                                                  in_stack_fffffffffffffbc8),0);
                              *(int *)(in_RDI + 0xa8) = iVar2;
                            }
                            else {
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[](local_10,(long)local_40);
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                              if (bVar1) {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)in_stack_fffffffffffffbd0,
                                     CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
                                iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                                           (size_t *)
                                                           CONCAT17(in_stack_fffffffffffffbcf,
                                                                    in_stack_fffffffffffffbc8),0);
                                *(int *)(in_RDI + 0xac) = iVar2;
                              }
                              else {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[](local_10,(long)local_40);
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                if (bVar1) {
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)in_stack_fffffffffffffbd0,
                                       CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8)
                                      );
                                  iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                                             (size_t *)
                                                             CONCAT17(in_stack_fffffffffffffbcf,
                                                                      in_stack_fffffffffffffbc8),0);
                                  *(int *)(in_RDI + 0xb0) = iVar2;
                                }
                                else {
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[](local_10,(long)local_40);
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                  if (bVar1) {
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)in_stack_fffffffffffffbd0,
                                         CONCAT17(in_stack_fffffffffffffbcf,
                                                  in_stack_fffffffffffffbc8));
                                    iVar2 = std::__cxx11::stoi((string *)in_stack_fffffffffffffbd0,
                                                               (size_t *)
                                                               CONCAT17(in_stack_fffffffffffffbcf,
                                                                        in_stack_fffffffffffffbc8),0
                                                              );
                                    *(int *)(in_RDI + 0xb4) = iVar2;
                                  }
                                  else {
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](local_10,(long)local_40);
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                    if (bVar1) {
                                      std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)in_stack_fffffffffffffbd0,
                                           CONCAT17(in_stack_fffffffffffffbcf,
                                                    in_stack_fffffffffffffbc8));
                                      fVar9 = std::__cxx11::stof((string *)in_stack_fffffffffffffbd0
                                                                 ,(size_t *)
                                                                  CONCAT17(in_stack_fffffffffffffbcf
                                                                           ,
                                                  in_stack_fffffffffffffbc8));
                                      *(double *)(in_RDI + 0xb8) = (double)fVar9;
                                    }
                                    else {
                                      std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](local_10,(long)local_40);
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                      if (bVar1) {
                                        pvVar3 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                        std::__cxx11::string::string(local_c0,(string *)pvVar3);
                                        std::__cxx11::string::operator=
                                                  ((string *)(in_RDI + 0xc0),local_c0);
                                        std::__cxx11::string::~string(local_c0);
                                      }
                                      else {
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[](local_10,(long)local_40);
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                        if (bVar1) {
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)in_stack_fffffffffffffbd0,
                                               CONCAT17(in_stack_fffffffffffffbcf,
                                                        in_stack_fffffffffffffbc8));
                                          iVar2 = std::__cxx11::stoi((string *)
                                                                     in_stack_fffffffffffffbd0,
                                                                     (size_t *)
                                                                     CONCAT17(
                                                  in_stack_fffffffffffffbcf,
                                                  in_stack_fffffffffffffbc8),0);
                                          *(int *)(in_RDI + 0xe0) = iVar2;
                                        }
                                        else {
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator[](local_10,(long)local_40);
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                          if (bVar1) {
                                            pvVar3 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                            std::__cxx11::string::string(local_e0,(string *)pvVar3);
                                            std::__cxx11::string::operator=
                                                      ((string *)(in_RDI + 0xe8),local_e0);
                                            std::__cxx11::string::~string(local_e0);
                                          }
                                          else {
                                            std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::operator[](local_10,(long)local_40);
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                            if (bVar1) {
                                              *(undefined1 *)(in_RDI + 0x108) = 1;
                                              local_40 = local_40 + -1;
                                            }
                                            else {
                                              std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::operator[](local_10,(long)local_40);
                                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                              if (bVar1) {
                                                *(undefined1 *)(in_RDI + 0x109) = 1;
                                                local_40 = local_40 + -1;
                                              }
                                              else {
                                                std::
                                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::operator[](local_10,(long)local_40);
                                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                if (bVar1) {
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  iVar2 = std::__cxx11::stoi((string *)
                                                                                                                                                          
                                                  in_stack_fffffffffffffbd0,
                                                  (size_t *)
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8),0);
                                                  *(int *)(in_RDI + 0x10c) = iVar2;
                                                }
                                                else {
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (bVar1) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  iVar2 = std::__cxx11::stoi((string *)
                                                                                                                                                          
                                                  in_stack_fffffffffffffbd0,
                                                  (size_t *)
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8),0);
                                                  *(int *)(in_RDI + 0x128) = iVar2;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (bVar1) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  local_e4 = std::__cxx11::stof((string *)
                                                                                                                                                                
                                                  in_stack_fffffffffffffbd0,
                                                  (size_t *)
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  *(double *)(in_RDI + 0x130) = (double)local_e4;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (bVar1) {
                                                    *(undefined1 *)(in_RDI + 0x112) = 1;
                                                    local_40 = local_40 + -1;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (bVar1) {
                                                    *(undefined1 *)(in_RDI + 0x111) = 1;
                                                    local_40 = local_40 + -1;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (bVar1) {
                                                    *(undefined1 *)(in_RDI + 0x110) = 1;
                                                    local_40 = local_40 + -1;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (bVar1) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  iVar2 = std::__cxx11::stoi((string *)
                                                                                                                                                          
                                                  in_stack_fffffffffffffbd0,
                                                  (size_t *)
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8),0);
                                                  *(long *)(in_RDI + 0x118) = (long)iVar2;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (bVar1) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  in_stack_fffffffffffffc3c =
                                                       std::__cxx11::stoi((string *)
                                                                          in_stack_fffffffffffffbd0,
                                                                          (size_t *)
                                                                          CONCAT17(
                                                  in_stack_fffffffffffffbcf,
                                                  in_stack_fffffffffffffbc8),0);
                                                  *(long *)(in_RDI + 0x120) =
                                                       (long)in_stack_fffffffffffffc3c;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  in_stack_fffffffffffffc38 =
                                                       CONCAT13(bVar1,(int3)
                                                  in_stack_fffffffffffffc38);
                                                  if (bVar1) {
                                                    pvVar3 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  std::__cxx11::string::string
                                                            ((string *)(local_128 + 0x20),
                                                             (string *)pvVar3);
                                                  std::__cxx11::string::operator=
                                                            ((string *)(in_RDI + 0x138),
                                                             (string *)(local_128 + 0x20));
                                                  std::__cxx11::string::~string
                                                            ((string *)(local_128 + 0x20));
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (bVar1) {
                                                    pvVar3 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  std::__cxx11::string::string
                                                            ((string *)local_128,(string *)pvVar3);
                                                  pAVar8 = (Args *)local_128;
                                                  std::__cxx11::string::operator=
                                                            ((string *)(in_RDI + 0x158),
                                                             (string *)pAVar8);
                                                  std::__cxx11::string::~string((string *)pAVar8);
                                                  getAutotuneMetric((Args *)CONCAT44(
                                                  in_stack_fffffffffffffc3c,
                                                  in_stack_fffffffffffffc38));
                                                  getAutotuneMetricLabel_abi_cxx11_(pAVar8);
                                                  std::__cxx11::string::~string(local_148);
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (bVar1) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  iVar2 = std::__cxx11::stoi((string *)
                                                                                                                                                          
                                                  in_stack_fffffffffffffbd0,
                                                  (size_t *)
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8),0);
                                                  *(int *)(in_RDI + 0x178) = iVar2;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (bVar1) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  iVar2 = std::__cxx11::stoi((string *)
                                                                                                                                                          
                                                  in_stack_fffffffffffffbd0,
                                                  (size_t *)
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8),0);
                                                  *(int *)(in_RDI + 0x17c) = iVar2;
                                                  }
                                                  else {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                                                   in_stack_fffffffffffffbc8));
                                                  if (!bVar1) {
                                                    poVar7 = std::operator<<((ostream *)&std::cerr,
                                                                             "Unknown argument: ");
                                                    pvVar3 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](local_10,(long)local_40);
                                                  poVar7 = std::operator<<(poVar7,(string *)pvVar3);
                                                  std::ostream::operator<<
                                                            (poVar7,std::
                                                  endl<char,std::char_traits<char>>);
                                                  printHelp(in_stack_fffffffffffffbd0);
                                                  exit(1);
                                                  }
                                                  pvVar3 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_fffffffffffffbd0,
                                                  CONCAT17(in_stack_fffffffffffffbcf,
                                                           in_stack_fffffffffffffbc8));
                                                  std::__cxx11::string::string
                                                            (local_168,(string *)pvVar3);
                                                  std::__cxx11::string::operator=
                                                            ((string *)(in_RDI + 0x180),local_168);
                                                  std::__cxx11::string::~string(local_168);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_40 = local_40 + 2;
  }
  poVar7 = std::operator<<((ostream *)&std::cerr,"Here is the help! Usage:");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  printHelp(in_stack_fffffffffffffbd0);
  exit(1);
}

Assistant:

void Args::parseArgs(const std::vector<std::string>& args) {
  std::string command(args[1]);
  if (command == "supervised") {
    model = model_name::sup;
    loss = loss_name::softmax;
    minCount = 1;
    minn = 0;
    maxn = 0;
    lr = 0.1;
  } else if (command == "cbow") {
    model = model_name::cbow;
  }
  for (int ai = 2; ai < args.size(); ai += 2) {
    if (args[ai][0] != '-') {
      std::cerr << "Provided argument without a dash! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    try {
      setManual(args[ai].substr(1));

      if (args[ai] == "-h") {
        std::cerr << "Here is the help! Usage:" << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      } else if (args[ai] == "-input") {
        input = std::string(args.at(ai + 1));
      } else if (args[ai] == "-output") {
        output = std::string(args.at(ai + 1));
      } else if (args[ai] == "-lr") {
        lr = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-lrUpdateRate") {
        lrUpdateRate = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dim") {
        dim = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-ws") {
        ws = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-epoch") {
        epoch = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCount") {
        minCount = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCountLabel") {
        minCountLabel = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-neg") {
        neg = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-wordNgrams") {
        wordNgrams = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-loss") {
        if (args.at(ai + 1) == "hs") {
          loss = loss_name::hs;
        } else if (args.at(ai + 1) == "ns") {
          loss = loss_name::ns;
        } else if (args.at(ai + 1) == "softmax") {
          loss = loss_name::softmax;
        } else if (
            args.at(ai + 1) == "one-vs-all" || args.at(ai + 1) == "ova") {
          loss = loss_name::ova;
        } else {
          std::cerr << "Unknown loss: " << args.at(ai + 1) << std::endl;
          printHelp();
          exit(EXIT_FAILURE);
        }
      } else if (args[ai] == "-bucket") {
        bucket = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minn") {
        minn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-maxn") {
        maxn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-thread") {
        thread = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-t") {
        t = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-label") {
        label = std::string(args.at(ai + 1));
      } else if (args[ai] == "-verbose") {
        verbose = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-pretrainedVectors") {
        pretrainedVectors = std::string(args.at(ai + 1));
      } else if (args[ai] == "-saveOutput") {
        saveOutput = true;
        ai--;
      } else if (args[ai] == "-saveSubwords") {
        saveSubwords = true;
        ai--;
      } else if (args[ai] == "-seed") {
        seed = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-factor") {
        factor = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-addWo") {
        float tmp = std::stof(args.at(ai + 1));
        addWo = tmp;
      } else if (args[ai] == "-qnorm") {
        qnorm = true;
        ai--;
      } else if (args[ai] == "-retrain") {
        retrain = true;
        ai--;
      } else if (args[ai] == "-qout") {
        qout = true;
        ai--;
      } else if (args[ai] == "-cutoff") {
        cutoff = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dsub") {
        dsub = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-autotune-validation") {
        autotuneValidationFile = std::string(args.at(ai + 1));
      } else if (args[ai] == "-autotune-metric") {
        autotuneMetric = std::string(args.at(ai + 1));
        getAutotuneMetric(); // throws exception if not able to parse
        getAutotuneMetricLabel(); // throws exception if not able to parse
      } else if (args[ai] == "-autotune-predictions") {
        autotunePredictions = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-autotune-duration") {
        autotuneDuration = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-autotune-modelsize") {
        autotuneModelSize = std::string(args.at(ai + 1));
      } else {
        std::cerr << "Unknown argument: " << args[ai] << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      }
    } catch (std::out_of_range) {
      std::cerr << args[ai] << " is missing an argument" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
  }
  if (input.empty() || output.empty()) {
    std::cerr << "Empty input or output path." << std::endl;
    printHelp();
    exit(EXIT_FAILURE);
  }
  if (wordNgrams <= 1 && maxn == 0 && !hasAutotune()) {
    bucket = 0;
  }
}